

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

CURLcode gzip_unencode_write(connectdata *conn,contenc_writer *writer,char *buf,size_t nbytes)

{
  ssize_t sVar1;
  z_stream *pzVar2;
  contenc_writer *pcVar3;
  CURLcode CVar4;
  anon_enum_32 aVar5;
  void *pvVar6;
  int iVar7;
  long local_50;
  ssize_t hlen_1;
  ssize_t hlen;
  z_stream *z;
  zlib_params *zp;
  size_t nbytes_local;
  char *buf_local;
  contenc_writer *writer_local;
  connectdata *conn_local;
  
  z = (z_stream *)&writer->params;
  hlen = (ssize_t)(writer + 1);
  iVar7 = (int)nbytes;
  zp = (zlib_params *)nbytes;
  nbytes_local = (size_t)buf;
  buf_local = (char *)writer;
  writer_local = (contenc_writer *)conn;
  if (*(int *)z == 6) {
    ((contenc_writer *)hlen)->handler = (content_encoding *)buf;
    *(int *)&writer[1].downstream = iVar7;
    conn_local._4_4_ = inflate_stream(conn,writer,ZLIB_INIT_GZIP);
  }
  else {
    switch(*(undefined4 *)z) {
    case 1:
      aVar5 = check_gzip_header((uchar *)buf,nbytes,&hlen_1);
      pcVar3 = writer_local;
      pzVar2 = z;
      sVar1 = hlen;
      if (aVar5 != CURLDIGESTALGO_MD5) {
        if ((aVar5 != CURLDIGESTALGO_MD5SESS) && (aVar5 == CURLDIGESTALGO_SHA256)) {
          *(int *)(hlen + 8) = (int)zp;
          pvVar6 = (*Curl_cmalloc)((size_t)*(undefined4 *)(hlen + 8));
          *(void **)hlen = pvVar6;
          if (*(long *)hlen == 0) {
            CVar4 = exit_zlib((connectdata *)writer_local,(z_stream *)hlen,(zlibInitState *)z,
                              CURLE_OUT_OF_MEMORY);
            return CVar4;
          }
          memcpy(*(void **)hlen,(void *)nbytes_local,(ulong)*(uint *)(hlen + 8));
          *(undefined4 *)&z->next_in = 4;
          return CURLE_OK;
        }
        CVar4 = process_zlib_error((connectdata *)writer_local,(z_stream *)hlen);
        CVar4 = exit_zlib((connectdata *)pcVar3,(z_stream *)sVar1,(zlibInitState *)pzVar2,CVar4);
        return CVar4;
      }
      *(size_t *)hlen = nbytes_local + hlen_1;
      *(int *)(hlen + 8) = (int)zp - (int)hlen_1;
      *(undefined4 *)&z->next_in = 5;
      break;
    case 3:
      ((contenc_writer *)hlen)->handler = (content_encoding *)buf;
      *(int *)&writer[1].downstream = iVar7;
      CVar4 = process_trailer(conn,(zlib_params *)z);
      return CVar4;
    case 4:
      *(int *)&writer[1].downstream = iVar7 + *(int *)&writer[1].downstream;
      pvVar6 = Curl_saferealloc(((contenc_writer *)hlen)->handler,
                                (ulong)*(uint *)&writer[1].downstream);
      *(void **)hlen = pvVar6;
      if (*(long *)hlen == 0) {
        CVar4 = exit_zlib((connectdata *)writer_local,(z_stream *)hlen,(zlibInitState *)z,
                          CURLE_OUT_OF_MEMORY);
        return CVar4;
      }
      memcpy((void *)((*(long *)hlen + (ulong)*(uint *)(hlen + 8)) - (long)zp),(void *)nbytes_local,
             (size_t)zp);
      aVar5 = check_gzip_header(*(uchar **)hlen,(ulong)*(uint *)(hlen + 8),&local_50);
      pcVar3 = writer_local;
      pzVar2 = z;
      sVar1 = hlen;
      if (aVar5 != CURLDIGESTALGO_MD5) {
        if ((aVar5 != CURLDIGESTALGO_MD5SESS) && (aVar5 == CURLDIGESTALGO_SHA256)) {
          return CURLE_OK;
        }
        CVar4 = process_zlib_error((connectdata *)writer_local,(z_stream *)hlen);
        CVar4 = exit_zlib((connectdata *)pcVar3,(z_stream *)sVar1,(zlibInitState *)pzVar2,CVar4);
        return CVar4;
      }
      (*Curl_cfree)(*(void **)hlen);
      *(size_t *)hlen = (long)zp + ((nbytes_local + local_50) - (ulong)*(uint *)(hlen + 8));
      *(int *)(hlen + 8) = *(int *)(hlen + 8) - (int)local_50;
      *(undefined4 *)&z->next_in = 5;
      break;
    case 5:
    default:
      ((contenc_writer *)hlen)->handler = (content_encoding *)buf;
      *(int *)&writer[1].downstream = iVar7;
    }
    if (*(int *)(hlen + 8) == 0) {
      conn_local._4_4_ = CURLE_OK;
    }
    else {
      conn_local._4_4_ =
           inflate_stream((connectdata *)writer_local,(contenc_writer *)buf_local,
                          ZLIB_GZIP_INFLATING);
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode gzip_unencode_write(struct connectdata *conn,
                                    contenc_writer *writer,
                                    const char *buf, size_t nbytes)
{
  zlib_params *zp = (zlib_params *) &writer->params;
  z_stream *z = &zp->z;     /* zlib state structure */

  if(zp->zlib_init == ZLIB_INIT_GZIP) {
    /* Let zlib handle the gzip decompression entirely */
    z->next_in = (Bytef *) buf;
    z->avail_in = (uInt) nbytes;
    /* Now uncompress the data */
    return inflate_stream(conn, writer, ZLIB_INIT_GZIP);
  }

#ifndef OLD_ZLIB_SUPPORT
  /* Support for old zlib versions is compiled away and we are running with
     an old version, so return an error. */
  return exit_zlib(conn, z, &zp->zlib_init, CURLE_WRITE_ERROR);

#else
  /* This next mess is to get around the potential case where there isn't
   * enough data passed in to skip over the gzip header.  If that happens, we
   * malloc a block and copy what we have then wait for the next call.  If
   * there still isn't enough (this is definitely a worst-case scenario), we
   * make the block bigger, copy the next part in and keep waiting.
   *
   * This is only required with zlib versions < 1.2.0.4 as newer versions
   * can handle the gzip header themselves.
   */

  switch(zp->zlib_init) {
  /* Skip over gzip header? */
  case ZLIB_INIT:
  {
    /* Initial call state */
    ssize_t hlen;

    switch(check_gzip_header((unsigned char *) buf, nbytes, &hlen)) {
    case GZIP_OK:
      z->next_in = (Bytef *) buf + hlen;
      z->avail_in = (uInt) (nbytes - hlen);
      zp->zlib_init = ZLIB_GZIP_INFLATING; /* Inflating stream state */
      break;

    case GZIP_UNDERFLOW:
      /* We need more data so we can find the end of the gzip header.  It's
       * possible that the memory block we malloc here will never be freed if
       * the transfer abruptly aborts after this point.  Since it's unlikely
       * that circumstances will be right for this code path to be followed in
       * the first place, and it's even more unlikely for a transfer to fail
       * immediately afterwards, it should seldom be a problem.
       */
      z->avail_in = (uInt) nbytes;
      z->next_in = malloc(z->avail_in);
      if(z->next_in == NULL) {
        return exit_zlib(conn, z, &zp->zlib_init, CURLE_OUT_OF_MEMORY);
      }
      memcpy(z->next_in, buf, z->avail_in);
      zp->zlib_init = ZLIB_GZIP_HEADER;  /* Need more gzip header data state */
      /* We don't have any data to inflate yet */
      return CURLE_OK;

    case GZIP_BAD:
    default:
      return exit_zlib(conn, z, &zp->zlib_init, process_zlib_error(conn, z));
    }

  }
  break;

  case ZLIB_GZIP_HEADER:
  {
    /* Need more gzip header data state */
    ssize_t hlen;
    z->avail_in += (uInt) nbytes;
    z->next_in = Curl_saferealloc(z->next_in, z->avail_in);
    if(z->next_in == NULL) {
      return exit_zlib(conn, z, &zp->zlib_init, CURLE_OUT_OF_MEMORY);
    }
    /* Append the new block of data to the previous one */
    memcpy(z->next_in + z->avail_in - nbytes, buf, nbytes);

    switch(check_gzip_header(z->next_in, z->avail_in, &hlen)) {
    case GZIP_OK:
      /* This is the zlib stream data */
      free(z->next_in);
      /* Don't point into the malloced block since we just freed it */
      z->next_in = (Bytef *) buf + hlen + nbytes - z->avail_in;
      z->avail_in = (uInt) (z->avail_in - hlen);
      zp->zlib_init = ZLIB_GZIP_INFLATING;   /* Inflating stream state */
      break;

    case GZIP_UNDERFLOW:
      /* We still don't have any data to inflate! */
      return CURLE_OK;

    case GZIP_BAD:
    default:
      return exit_zlib(conn, z, &zp->zlib_init, process_zlib_error(conn, z));
    }

  }
  break;

  case ZLIB_EXTERNAL_TRAILER:
    z->next_in = (Bytef *) buf;
    z->avail_in = (uInt) nbytes;
    return process_trailer(conn, zp);

  case ZLIB_GZIP_INFLATING:
  default:
    /* Inflating stream state */
    z->next_in = (Bytef *) buf;
    z->avail_in = (uInt) nbytes;
    break;
  }

  if(z->avail_in == 0) {
    /* We don't have any data to inflate; wait until next time */
    return CURLE_OK;
  }

  /* We've parsed the header, now uncompress the data */
  return inflate_stream(conn, writer, ZLIB_GZIP_INFLATING);
#endif
}